

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

bool __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::has_star_in_row(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                  *this,Index row)

{
  pointer pVVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer pAVar4;
  
  pVVar1 = (this->graph_->vertices_).
           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = *(pointer *)((long)(pVVar1 + row) + 0x28);
  pAVar3 = *(pointer *)&((Adjacencies *)((long)(pVVar1 + row) + 0x20))->vector_;
  do {
    pAVar4 = pAVar3;
    if (pAVar4 == pAVar2) break;
    pAVar3 = pAVar4 + 1;
  } while ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start[pAVar4->edge_] != 1);
  return pAVar4 != pAVar2;
}

Assistant:

bool
Matching<GRAPH, COST, MASK>::has_star_in_row(Index const row) const
{
    for (auto it = graph_.adjacenciesFromVertexBegin(row);
         it != graph_.adjacenciesFromVertexEnd(row); ++it)
        if (mask_[it->edge()] == STARRED)
            return true;
    return false;
}